

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_1e5ebb::TestcaseBase::toString<long_double>(TestcaseBase *this,longdouble t)

{
  OstreamBuffer *in_RSI;
  string *in_RDI;
  string *s;
  TestcaseBase *in_stack_ffffffffffffff78;
  string local_50 [39];
  undefined1 local_29;
  
  binlog::detail::OstreamBuffer::operator<<(in_RSI,(longdouble)CONCAT28((short)in_RDI,in_RDI));
  local_29 = 0;
  (anonymous_namespace)::TestcaseBase::result_abi_cxx11_(in_stack_ffffffffffffff78);
  std::__cxx11::string::string(local_50);
  std::__cxx11::ostringstream::str((string *)in_RSI);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }